

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O2

void rcnb_encode_byte(uchar value_in,wchar_t **value_out)

{
  ushort uVar1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  unsigned_short *puVar5;
  
  if ((char)value_in < '\0') {
    value_in = value_in & 0x7f;
    pwVar3 = L"bBƀƁƃƄƅßÞþ";
    pwVar4 = L"nNŃńŅņŇňƝƞÑǸǹȠȵ";
    puVar5 = &sb;
  }
  else {
    pwVar3 = L"cCĆćĈĉĊċČčƇƈÇȻȼ";
    pwVar4 = L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ";
    puVar5 = &sc;
  }
  uVar1 = *puVar5;
  pwVar2 = *value_out;
  *pwVar2 = pwVar4[(ushort)(value_in / uVar1)];
  pwVar2[1] = pwVar3[(ushort)((ushort)value_in % uVar1)];
  *value_out = pwVar2 + 2;
  return;
}

Assistant:

void rcnb_encode_byte(unsigned char value_in, wchar_t** value_out)
{
    if (value_in > 0x7F) {
        value_in = (unsigned char)(value_in & 0x7F);
        *(*value_out)++ = cn[value_in / sb];
        *(*value_out)++ = cb[value_in % sb];
        return;
    }
    *(*value_out)++ = cr[value_in / sc];
    *(*value_out)++ = cc[value_in % sc];
}